

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

int __thiscall
CVmObjByteArray::getp_digestMD5(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  ulong uVar3;
  size_t s1;
  long lVar4;
  uint uVar5;
  size_t s3;
  ulong uVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  ulong uVar8;
  size_t s2;
  size_t avail;
  ulong uVar9;
  ulong uVar10;
  char *buf_00;
  uchar hash [16];
  char buf [32];
  md5_state_t ctx;
  
  if (oargc == (uint *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *oargc;
  }
  if ((getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                  CONCAT44(in_register_00000034,self)), iVar1 != 0)) {
    getp_digestMD5::desc.min_argc_ = 0;
    getp_digestMD5::desc.opt_argc_ = 2;
    getp_digestMD5::desc.varargs_ = 0;
    __cxa_guard_release(&getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_digestMD5::desc);
  if (iVar1 == 0) {
    uVar8 = (ulong)*(uint *)(this->super_CVmObject).ext_;
    uVar3 = uVar8;
    uVar9 = 1;
    if (uVar5 != 0) {
      iVar1 = CVmBif::pop_int_val();
      uVar9 = (ulong)iVar1;
      if (uVar5 != 1) {
        iVar1 = CVmBif::pop_int_val();
        uVar3 = (long)iVar1;
      }
    }
    uVar8 = uVar8 + 1;
    uVar6 = uVar8;
    if (uVar9 < uVar8) {
      uVar6 = uVar9;
    }
    if ((long)uVar9 < 1) {
      uVar6 = 1;
    }
    uVar9 = uVar8 - uVar6;
    if ((long)uVar3 < (long)(uVar8 - uVar6)) {
      uVar9 = uVar3;
    }
    md5_init(&ctx);
    uVar6 = uVar6 - 1;
    uVar7 = (ulong)((uint)uVar6 & 0x7fff);
    uVar10 = 0x8000 - uVar7;
    uVar8 = 0;
    if (-1 < (long)uVar3) {
      uVar8 = uVar9;
    }
    for (; 0 < (long)uVar8; uVar8 = uVar8 - uVar3) {
      uVar3 = uVar10;
      if (uVar8 < uVar10) {
        uVar3 = uVar8;
      }
      md5_append(&ctx,(md5_byte_t *)
                      (*(long *)(*(long *)((this->super_CVmObject).ext_ + (uVar6 >> 0x1c) * 8 + 4) +
                                (ulong)((uint)(uVar6 >> 0xf) & 0x1fff) * 8) + uVar7),(int)uVar3);
    }
    md5_finish(&ctx,hash);
    buf_00 = buf;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      byte_to_xdigits(buf_00,hash[lVar4]);
      buf_00 = buf_00 + 2;
    }
    vVar2 = CVmObjString::create(0,buf,0x20);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar2;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_digestMD5(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(0, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the starting index and length */
    long cnt = get_element_count();
    long idx = argc >= 1 ? CVmBif::pop_int_val(vmg0_) : 1;
    long len = argc >= 2 ? CVmBif::pop_int_val(vmg0_) : cnt;

    /* limit the starting index to the available range */
    if (idx < 1)
        idx = 1;
    else if (idx > cnt + 1)
        idx = cnt + 1;

    /* limit the length to the range remaining */
    if (len < 0)
        len = 0;
    else if (len > cnt - idx + 1)
        len = cnt - idx + 1;

    /* set up the hash accumulator */
    md5_state_t ctx;
    md5_init(&ctx);

    /* feed the selected range of bytes into the hash */
    while (len > 0)
    {
        /* get the next chunk */
        size_t avail;
        unsigned char *p = get_ele_ptr(idx, &avail);

        /* use the whole chunk, up to the amount remaining in the request */
        size_t cur = (len < (long)avail ? (size_t)len : avail);

        /* feed this chunk into the hash */
        md5_append(&ctx, p, cur);

        /* deduct this chunk from the remaining length */
        len -= cur;
    }

    /* calculate the hash result */
    const int HASH_BYTES = 16;
    unsigned char hash[HASH_BYTES];
    md5_finish(&ctx, hash);

    /* convert the binary hash to printable hex digits */
    char buf[HASH_BYTES*2], *bufp = buf;
    for (int i = 0 ; i < HASH_BYTES ; ++i, bufp += 2)
        byte_to_xdigits(bufp, hash[i]);

    /* return the string */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, buf, HASH_BYTES*2));

    /* handled */
    return TRUE;
}